

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint64_t extract_uint64(uint8_t *arg_pos)

{
  uint64_t arg;
  uint8_t *arg_pos_local;
  
  return (ulong)arg_pos[7] |
         (ulong)arg_pos[6] << 8 |
         (ulong)arg_pos[5] << 0x10 |
         (ulong)arg_pos[4] << 0x18 |
         (ulong)arg_pos[3] << 0x20 |
         (ulong)arg_pos[2] << 0x28 | (ulong)arg_pos[1] << 0x30 | (ulong)*arg_pos << 0x38;
}

Assistant:

static uint64_t extract_uint64(const uint8_t *arg_pos)
{
    uint64_t arg = 0;
    arg |= (((uint64_t)*arg_pos++) << 56);
    arg |= (((uint64_t)*arg_pos++) << 48);
    arg |= (((uint64_t)*arg_pos++) << 40);
    arg |= (((uint64_t)*arg_pos++) << 32);
    arg |= (((uint64_t)*arg_pos++) << 24);
    arg |= (((uint64_t)*arg_pos++) << 16);
    arg |= (((uint64_t)*arg_pos++) << 8);
    arg |= (((uint64_t)*arg_pos++));
    return arg;
}